

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflowsol.cpp
# Opt level: O3

vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
* __thiscall
ArcflowSol::remove_excess
          (vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
           *__return_storage_ptr__,ArcflowSol *this,
          vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
          *sol,vector<int,_std::allocator<int>_> *_dem)

{
  _Rb_tree_header *__last;
  int *piVar1;
  pointer piVar2;
  pointer pIVar3;
  pointer ppVar4;
  pointer ppVar5;
  long lVar6;
  pointer ppVar7;
  iterator iVar8;
  pointer ppVar9;
  int iVar10;
  pointer ppVar11;
  mapped_type *pmVar12;
  _Base_ptr p_Var13;
  ulong uVar14;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__k;
  int iVar15;
  int *it;
  pointer piVar16;
  key_type *__k_00;
  vector<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::allocator<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>>
  *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_int>_>,_std::_Rb_tree_iterator<std::pair<const_int,_int>_>_>
  pVar17;
  map<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int,_std::less<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>_>
  mp;
  vector<int,_std::allocator<int>_> rm;
  vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  *finalsol;
  vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  tmp;
  int local_100;
  allocator_type local_f9;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_f8;
  key_type *local_c8;
  iterator iStack_c0;
  int *local_b8;
  vector<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::allocator<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>>
  *local_b0;
  pointer local_a8;
  _Rb_tree_iterator<std::pair<const_int,_int>_> local_a0;
  pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> local_98;
  pointer local_78;
  pointer ppStack_70;
  pointer local_68;
  vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  local_58;
  pointer local_38;
  
  local_58.
  super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVar11 = (sol->
            super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_38 = (sol->
             super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  __last = &local_f8._M_impl.super__Rb_tree_header;
  local_b0 = (vector<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::allocator<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>>
              *)__return_storage_ptr__;
  if (ppVar11 != local_38) {
    do {
      local_f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_f8._M_impl.super__Rb_tree_header._M_node_count = 0;
      piVar2 = (ppVar11->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      piVar16 = (ppVar11->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_f8._M_impl.super__Rb_tree_header._M_header._M_left = &__last->_M_header;
      local_f8._M_impl.super__Rb_tree_header._M_header._M_right = &__last->_M_header;
      local_a8 = ppVar11;
      for (; piVar16 != piVar2; piVar16 = piVar16 + 1) {
        pmVar12 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&local_f8,piVar16);
        *pmVar12 = *pmVar12 + 1;
      }
      local_c8 = (key_type *)0x0;
      iStack_c0._M_current = (key_type *)0x0;
      local_b8 = (int *)0x0;
      local_100 = local_a8->first;
      if (0 < local_100) {
        do {
          if (iStack_c0._M_current != local_c8) {
            iStack_c0._M_current = local_c8;
          }
          p_Var13 = local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
          if ((_Rb_tree_header *)local_f8._M_impl.super__Rb_tree_header._M_header._M_left != __last)
          {
            do {
              iVar15 = (_dem->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start
                       [(this->inst).items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                        super__Vector_impl_data._M_start[(int)p_Var13[1]._M_color].type];
              iVar10 = *(int *)&p_Var13[1].field_0x4;
              if (iVar15 < *(int *)&p_Var13[1].field_0x4) {
                iVar10 = iVar15;
              }
              *(int *)&p_Var13[1].field_0x4 = iVar10;
              if (iVar10 == 0) {
                if (iStack_c0._M_current == local_b8) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&local_c8,iStack_c0,
                             (int *)(p_Var13 + 1));
                }
                else {
                  *iStack_c0._M_current = p_Var13[1]._M_color;
                  iStack_c0._M_current = iStack_c0._M_current + 1;
                }
              }
              p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
              iVar8._M_current = iStack_c0._M_current;
              __k_00 = local_c8;
            } while ((_Rb_tree_header *)p_Var13 != __last);
            for (; __k_00 != iVar8._M_current; __k_00 = __k_00 + 1) {
              pVar17 = std::
                       _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                       ::equal_range(&local_f8,__k_00);
              std::
              _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
              ::_M_erase_aux(&local_f8,(_Base_ptr)pVar17.first._M_node,
                             (_Base_ptr)pVar17.second._M_node);
            }
          }
          local_a0._M_node = local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
          iVar15 = local_100;
          if ((_Rb_tree_header *)local_f8._M_impl.super__Rb_tree_header._M_header._M_left != __last)
          {
            pIVar3 = (this->inst).items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar16 = (_dem->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            p_Var13 = local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
            do {
              iVar10 = piVar16[pIVar3[(int)p_Var13[1]._M_color].type] /
                       *(int *)&p_Var13[1].field_0x4;
              if (iVar10 < iVar15) {
                iVar15 = iVar10;
              }
              p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
            } while ((_Rb_tree_header *)p_Var13 != __last);
          }
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          vector<std::_Rb_tree_iterator<std::pair<int_const,int>>,void>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_78,
                     local_a0,(_Rb_tree_iterator<std::pair<const_int,_int>_>)__last,&local_f9);
          local_98.second.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_start = local_78;
          local_98.second.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_finish = ppStack_70;
          local_98.second.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = local_68;
          local_78 = (pointer)0x0;
          ppStack_70 = (pointer)0x0;
          local_68 = (pointer)0x0;
          local_98.first = iVar15;
          std::
          vector<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::allocator<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>>
          ::
          emplace_back<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                    ((vector<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::allocator<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>>
                      *)&local_58,&local_98);
          if (local_98.second.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98.second.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_78 != (pointer)0x0) {
            operator_delete(local_78);
          }
          if ((_Rb_tree_header *)local_f8._M_impl.super__Rb_tree_header._M_header._M_left != __last)
          {
            pIVar3 = (this->inst).items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar16 = (_dem->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            p_Var13 = local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
            do {
              piVar1 = piVar16 + pIVar3[(int)p_Var13[1]._M_color].type;
              *piVar1 = *piVar1 - *(int *)&p_Var13[1].field_0x4 * iVar15;
              p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
            } while ((_Rb_tree_header *)p_Var13 != __last);
          }
          local_100 = local_100 - iVar15;
        } while (0 < local_100);
        if (local_c8 != (key_type *)0x0) {
          operator_delete(local_c8);
        }
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&local_f8);
      ppVar9 = local_58.
               super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ppVar11 = local_a8 + 1;
    } while (ppVar11 != local_38);
    local_f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_f8._M_impl.super__Rb_tree_header._M_node_count = 0;
    if (local_58.
        super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_58.
        super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_f8._M_impl.super__Rb_tree_header._M_header._M_left = &__last->_M_header;
      local_f8._M_impl.super__Rb_tree_header._M_header._M_right = &__last->_M_header;
      ppVar7 = local_58.
               super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        __k = &ppVar7->second;
        ppVar4 = (__k->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        ppVar5 = (__k->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        if (ppVar4 != ppVar5) {
          uVar14 = (long)ppVar5 - (long)ppVar4 >> 3;
          lVar6 = 0x3f;
          if (uVar14 != 0) {
            for (; uVar14 >> lVar6 == 0; lVar6 = lVar6 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (ppVar4,ppVar5,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (ppVar4,ppVar5);
        }
        iVar15 = *(int *)((long)(__k + -1) + 0x10);
        pmVar12 = std::
                  map<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int,_std::less<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>_>
                  ::operator[]((map<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int,_std::less<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>_>
                                *)&local_f8,__k);
        this_00 = local_b0;
        *pmVar12 = *pmVar12 + iVar15;
        ppVar7 = (pointer)(__k + 1);
      } while ((pointer)(__k + 1) != ppVar9);
      *(undefined8 *)local_b0 = 0;
      *(undefined8 *)(local_b0 + 8) = 0;
      *(undefined8 *)(local_b0 + 0x10) = 0;
      if ((_Rb_tree_header *)local_f8._M_impl.super__Rb_tree_header._M_header._M_left != __last) {
        p_Var13 = local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          local_98.first = *(int *)&p_Var13[1]._M_right;
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                    (&local_98.second,
                     (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     (p_Var13 + 1));
          std::
          vector<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::allocator<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>>
          ::
          emplace_back<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                    (this_00,&local_98);
          if (local_98.second.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98.second.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
        } while ((_Rb_tree_header *)p_Var13 != __last);
      }
      goto LAB_0011178d;
    }
  }
  local_f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  *(undefined8 *)local_b0 = 0;
  *(pointer *)(local_b0 + 8) = (pointer)0x0;
  *(pointer *)(local_b0 + 0x10) = (pointer)0x0;
  this_00 = local_b0;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_left = &__last->_M_header;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_right = &__last->_M_header;
LAB_0011178d:
  std::
  _Rb_tree<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>,_std::_Select1st<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>,_std::less<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>,_std::_Select1st<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>,_std::less<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>_>
               *)&local_f8);
  std::
  vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  ::~vector(&local_58);
  return (vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
          *)this_00;
}

Assistant:

std::vector<pattern_pair> ArcflowSol::remove_excess(const std::vector<pattern_int> &sol,
													std::vector<int> *_dem) const {
	std::vector<int> &dem = *_dem;
	std::vector<pattern_pair> tmp;
	for (const pattern_int &pat : sol) {
		std::map<int, int> count;
		for (const int &it : pat.second) {
			count[it] += 1;
		}
		std::vector<int> rm;
		int rep = pat.first;
		while (rep > 0) {
			rm.clear();
			for (auto &kvpair : count) {
				int type = inst.items[kvpair.first].type;
				kvpair.second = std::min(kvpair.second, dem[type]);
				if (kvpair.second == 0) {
					rm.push_back(kvpair.first);
				}
			}
			for (const int &ind : rm) {
				count.erase(ind);
			}

			int f = rep;
			for (const auto &kvpair : count) {
				int type = inst.items[kvpair.first].type;
				f = std::min(f, dem[type] / kvpair.second);
			}
			rep -= f;

			tmp.push_back(MP(f, std::vector<int_pair>(all(count))));
			for (const auto &kvpair : count) {
				int type = inst.items[kvpair.first].type;
				dem[type] -= f * kvpair.second;
			}
		}
	}

	std::map<std::vector<int_pair>, int> mp;
	for (pattern_pair &pp : tmp) {
		sort(all(pp.second));
		mp[pp.second] += pp.first;
	}

	std::vector<pattern_pair> finalsol;
	for (const auto &kvpair : mp) {
		finalsol.push_back(MP(kvpair.second, kvpair.first));
	}
	return finalsol;
}